

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_frame.cpp
# Opt level: O1

MPP_RET mpp_frame_deinit(MppFrame *frame)

{
  MppFrame pvVar1;
  MPP_RET MVar2;
  
  if ((frame != (MppFrame *)0x0) &&
     (MVar2 = _check_is_mpp_frame("mpp_frame_deinit",*frame), MVar2 == MPP_OK)) {
    pvVar1 = *frame;
    if (*(MppBuffer *)((long)pvVar1 + 0x98) != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(*(MppBuffer *)((long)pvVar1 + 0x98),"mpp_frame_deinit");
    }
    if (*(MppMeta *)((long)pvVar1 + 0xb0) != (MppMeta)0x0) {
      mpp_meta_put(*(MppMeta *)((long)pvVar1 + 0xb0));
    }
    if (*(MppStopwatch *)((long)pvVar1 + 0xb8) != (MppStopwatch)0x0) {
      mpp_stopwatch_put(*(MppStopwatch *)((long)pvVar1 + 0xb8));
    }
    mpp_mem_pool_put_f("mpp_frame_deinit",mpp_frame_pool,*frame);
    *frame = (MppFrame)0x0;
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_frame","invalid NULL pointer input\n","mpp_frame_deinit");
  return MPP_ERR_NULL_PTR;
}

Assistant:

MPP_RET mpp_frame_deinit(MppFrame *frame)
{
    if (NULL == frame || check_is_mpp_frame(*frame)) {
        mpp_err_f("invalid NULL pointer input\n");
        return MPP_ERR_NULL_PTR;
    }

    MppFrameImpl *p = (MppFrameImpl *)*frame;
    if (p->buffer)
        mpp_buffer_put(p->buffer);

    if (p->meta)
        mpp_meta_put(p->meta);

    if (p->stopwatch)
        mpp_stopwatch_put(p->stopwatch);

    mpp_mem_pool_put(mpp_frame_pool, *frame);
    *frame = NULL;
    return MPP_OK;
}